

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O0

err_t dstuPointCompress(octet *xpoint,dstu_params *params,octet *point)

{
  bool_t bVar1;
  int iVar2;
  void *in_RDX;
  byte *in_RDI;
  void *stack;
  word *y;
  word *x;
  ec_o *ec;
  err_t code;
  dstu_deep_i in_stack_00000048;
  dstu_params *in_stack_00000050;
  ec_o **in_stack_00000058;
  word *src;
  word *dest;
  word *a;
  qr_o *f;
  undefined4 in_stack_ffffffffffffffd8;
  err_t local_4;
  
  f = (qr_o *)0x0;
  local_4 = dstuEcCreate(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  if (local_4 == 0) {
    bVar1 = memIsValid(in_RDX,f->mod[7] << 1);
    if ((bVar1 == 0) || (bVar1 = memIsValid(in_RDI,f->mod[7]), bVar1 == 0)) {
      dstuEcClose((ec_o *)0x17584f);
      local_4 = 0x6d;
    }
    else {
      a = (word *)((long)&(f->hdr).keep + (f->hdr).keep);
      dest = a + f->mod[6];
      src = dest + f->mod[6];
      iVar2 = (*(code *)f->mod[8])(a,in_RDX,f->mod,src);
      if ((iVar2 == 0) ||
         (iVar2 = (*(code *)f->mod[8])(dest,(long)in_RDX + f->mod[7],f->mod,src), iVar2 == 0)) {
        dstuEcClose((ec_o *)0x175916);
        local_4 = 0x191;
      }
      else {
        bVar1 = wwIsZero(a,f->mod[6]);
        if (bVar1 == 0) {
          (*(code *)f->mod[0x10])(dest,dest,a,f->mod,src);
          memMove(dest,src,0x1759a0);
          *in_RDI = *in_RDI & 0xfe;
          bVar1 = gf2Tr((word *)CONCAT44(local_4,in_stack_ffffffffffffffd8),f,a);
          *in_RDI = *in_RDI | (byte)bVar1;
          dstuEcClose((ec_o *)0x1759df);
          local_4 = 0;
        }
        else {
          dstuEcClose((ec_o *)0x175949);
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

err_t dstuPointCompress(octet xpoint[], const dstu_params* params, 
	const octet point[])
{
	err_t code;
	// состояние
	ec_o* ec = 0;
	word* x;
	word* y;
	void* stack;
	// старт
	code = dstuEcCreate(&ec, params, dstuPointCompress_deep);
	ERR_CALL_CHECK(code);
	// проверить входные указатели
	if (!memIsValid(point, 2 * ec->f->no) || 
		!memIsValid(xpoint, ec->f->no))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	x = objEnd(ec, word);
	y = x + ec->f->n;
	stack = y + ec->f->n;
	// загрузить точку
	if (!qrFrom(x, point, ec->f, stack) ||
		!qrFrom(y, point + ec->f->no, ec->f, stack))
	{
		dstuEcClose(ec);
		return ERR_BAD_POINT;
	}
	// x == 0?
	if (wwIsZero(x, ec->f->n))
	{
		dstuEcClose(ec);
		return ERR_OK;
	}
	// y <- y / x
	qrDiv(y, y, x, ec->f, stack);
	// xpoint <- x(point), xpoint_0 <- tr(y)
	memMove(xpoint, point, ec->f->no);
	xpoint[0] &= 0xFE;
	xpoint[0] |= gf2Tr(y, ec->f, stack);
	// завершение
	dstuEcClose(ec);
	return ERR_OK;
}